

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unbuf.t.cc
# Opt level: O0

int main(int argc,char **argv)

{
  int local_28;
  int local_24;
  int nprocs;
  int pid;
  MPI_Comm comm;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  comm = (MPI_Comm)argv;
  argv_local._0_4_ = argc;
  MPI_Init(&argv_local,&comm);
  _nprocs = (MPI_Comm)&ompi_mpi_comm_world;
  MPI_Comm_rank(&ompi_mpi_comm_world,&local_24);
  MPI_Comm_size(_nprocs,&local_28);
  test_1(_nprocs,local_24,local_28);
  MPI_Finalize();
  return 0;
}

Assistant:

int main( int argc, char ** argv ) 
{
    MPI_Init( &argc, &argv );

    MPI_Comm comm = MPI_COMM_WORLD;

    int pid, nprocs;
    MPI_Comm_rank( comm, & pid );
    MPI_Comm_size( comm, & nprocs );

    test_1( comm, pid, nprocs );

    MPI_Finalize( );
    return 0;
}